

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

BGZF * bgzf_write_init(char *mode)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uint local_28;
  int compress_level;
  BGZF *fp;
  char *mode_local;
  
  mode_local = (char *)calloc(1,0x60);
  *(uint *)mode_local = *(uint *)mode_local & 0xfffcffff | 0x10000;
  local_28 = mode2level(mode);
  if (local_28 == 0xfffffffe) {
    *(uint *)mode_local = *(uint *)mode_local & 0x9fffffff;
  }
  else {
    *(uint *)mode_local = *(uint *)mode_local & 0x9fffffff | 0x20000000;
    pvVar2 = malloc(0x10000);
    *(void **)((long)mode_local + 0x20) = pvVar2;
    pvVar2 = malloc(0x10000);
    *(void **)((long)mode_local + 0x28) = pvVar2;
    if ((int)local_28 < 0) {
      local_28 = 0xffffffff;
    }
    *(uint *)mode_local = *(uint *)mode_local & 0xe00fffff | (local_28 & 0x1ff) << 0x14;
    if (9 < (int)(*(uint *)mode_local << 3) >> 0x17) {
      *(uint *)mode_local = *(uint *)mode_local & 0xe00fffff | 0x1ff00000;
    }
    pcVar3 = strchr(mode,0x67);
    if (pcVar3 != (char *)0x0) {
      *(uint *)mode_local = *(uint *)mode_local & 0x7fffffff | 0x80000000;
      pvVar2 = calloc(1,0x70);
      *(void **)((long)mode_local + 0x58) = pvVar2;
      *(undefined8 *)(*(long *)((long)mode_local + 0x58) + 0x40) = 0;
      *(undefined8 *)(*(long *)((long)mode_local + 0x58) + 0x48) = 0;
      iVar1 = deflateInit2_(*(undefined8 *)((long)mode_local + 0x58),
                            (int)(*(uint *)mode_local << 3) >> 0x17,8,0x1f,8,0,"1.2.11",0x70);
      if (iVar1 != 0) {
        mode_local = (char *)0x0;
      }
    }
  }
  return (BGZF *)mode_local;
}

Assistant:

static BGZF *bgzf_write_init(const char *mode)
{
    BGZF *fp;
    fp = (BGZF*)calloc(1, sizeof(BGZF));
    fp->is_write = 1;
    int compress_level = mode2level(mode);
    if ( compress_level==-2 )
    {
        fp->is_compressed = 0;
        return fp;
    }
    fp->is_compressed = 1;
    fp->uncompressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compress_level = compress_level < 0? Z_DEFAULT_COMPRESSION : compress_level; // Z_DEFAULT_COMPRESSION==-1
    if (fp->compress_level > 9) fp->compress_level = Z_DEFAULT_COMPRESSION;
    if ( strchr(mode,'g') )
    {
        // gzip output
        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*)calloc(1,sizeof(z_stream));
        fp->gz_stream->zalloc = NULL;
        fp->gz_stream->zfree  = NULL;
        if ( deflateInit2(fp->gz_stream, fp->compress_level, Z_DEFLATED, 15|16, 8, Z_DEFAULT_STRATEGY)!=Z_OK ) return NULL;
    }
    return fp;
}